

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_size_quantity_Test::
PriceUpdateDecoderTest_test_decode_size_quantity_Test
          (PriceUpdateDecoderTest_test_decode_size_quantity_Test *this)

{
  PriceUpdateDecoderTest_test_decode_size_quantity_Test *this_local;
  
  PriceUpdateDecoderTest::PriceUpdateDecoderTest(&this->super_PriceUpdateDecoderTest);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_test_decode_size_quantity_Test_003d8d70;
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_size_quantity)
{
    uint64_t size = 3823908209333543L;
    Varint::WriteU64(buffer, size);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::LONG, "field", FieldEncodingEnum::VARINT, 0);
    PriceField price_field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::LONG, price_field.GetType());
    EXPECT_EQ(size, price_field.GetLong());
}